

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

Ref<embree::XML> __thiscall embree::XML::childOpt(XML *this,string *childID)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    pcVar1 = childID[4]._M_dataplus._M_p;
    if ((ulong)((long)(childID[4]._M_string_length - (long)pcVar1) >> 3) <= uVar4) {
      (this->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
      return (Ref<embree::XML>)this;
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(pcVar1 + uVar4 * 8) + 0x30),in_RDX);
    if (_Var3) break;
    uVar4 = uVar4 + 1;
  }
  pp_Var2 = *(_func_int ***)(childID[4]._M_dataplus._M_p + uVar4 * 8);
  (this->super_RefCount)._vptr_RefCount = pp_Var2;
  if (pp_Var2 == (_func_int **)0x0) {
    return (Ref<embree::XML>)this;
  }
  (**(code **)(*pp_Var2 + 0x10))();
  return (Ref<embree::XML>)this;
}

Assistant:

const Ref<XML> childOpt(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      return null;
    }